

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializers.hpp
# Opt level: O2

XMLNodeAdapter * BSDFData::operator>>(XMLNodeAdapter *node,LengthWithCavity *lengthWithCavity)

{
  allocator<char> local_51;
  string local_50;
  code *local_30 [2];
  code *local_20;
  code *local_18;
  
  FileParse::operator>>(node,&lengthWithCavity->value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"cavity",(allocator<char> *)local_30);
  FileParse::loadAttribute<XMLNodeAdapter,_int,_0>(node,&local_50,&lengthWithCavity->cavity);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"unit",&local_51);
  local_30[1] = (code *)0x0;
  local_30[0] = LengthUnitFromString;
  local_18 = std::
             _Function_handler<BSDFData::LengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::LengthUnit_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<BSDFData::LengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>),_BSDFData::LengthUnit_(*)(std::basic_string_view<char,_std::char_traits<char>_>)>
             ::_M_manager;
  FileParse::loadAttribute<XMLNodeAdapter,_BSDFData::LengthUnit,_0>
            (node,&local_50,&lengthWithCavity->unit,
             (function<BSDFData::LengthUnit_(std::basic_string_view<char,_std::char_traits<char>_>)>
              *)local_30);
  std::_Function_base::~_Function_base((_Function_base *)local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return node;
}

Assistant:

const NodeAdapter & operator>>(const NodeAdapter & node,
                                   BSDFData::LengthWithCavity & lengthWithCavity)
    {
        using FileParse::operator>>;   // operators for basic C++ types are in the FileParse
                                       // namespace

        node >> lengthWithCavity.value;
        FileParse::loadAttribute(node, "cavity", lengthWithCavity.cavity);
        FileParse::loadAttribute<NodeAdapter, BSDFData::LengthUnit>(
          node, "unit", lengthWithCavity.unit, LengthUnitFromString);

        return node;
    }